

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeSorterWrite(VdbeCursor *pCsr,Mem *pVal)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VdbeSorter *pSorter;
  u8 *puVar6;
  SorterRecord *pSVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  SorterRecord *pSVar11;
  u8 *puVar12;
  ulong uVar13;
  SorterRecord *pSVar14;
  uint uVar15;
  int iVar16;
  SorterRecord *nBytes;
  int t;
  uint local_3c;
  Mem *local_38;
  
  pSorter = (pCsr->uc).pSorter;
  bVar2 = pVal->z[1];
  local_3c = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    sqlite3GetVarint32((uchar *)(pVal->z + 1),&local_3c);
  }
  if (local_3c == 7 || 8 < local_3c - 1) {
    if ((local_3c & 1) == 0 || (int)local_3c < 0xb) {
      pSorter->typeMask = '\0';
    }
    else {
      pSorter->typeMask = pSorter->typeMask & 2;
    }
  }
  else {
    pSorter->typeMask = pSorter->typeMask & 1;
  }
  iVar3 = pVal->n;
  iVar9 = 1;
  if (0x7f < (ulong)(long)iVar3) {
    iVar9 = 1;
    uVar13 = (long)iVar3;
    do {
      iVar9 = iVar9 + 1;
      bVar8 = 0x3fff < uVar13;
      uVar13 = uVar13 >> 7;
    } while (bVar8);
  }
  iVar16 = iVar3 + 0x10;
  iVar9 = iVar3 + iVar9;
  iVar4 = pSorter->mxPmaSize;
  iVar10 = 0;
  if (iVar4 != 0) {
    iVar10 = 0;
    if ((pSorter->list).aMemory == (u8 *)0x0) {
      iVar5 = (pSorter->list).szPMA;
      if (iVar5 <= iVar4) {
        if (iVar5 <= pSorter->mnPmaSize) goto LAB_00143879;
        bVar8 = mem0.nearlyFull != 0;
        goto LAB_00143856;
      }
    }
    else {
      bVar8 = iVar4 < pSorter->iMemory + iVar16 && pSorter->iMemory != 0;
LAB_00143856:
      if (!bVar8) goto LAB_00143879;
    }
    iVar10 = vdbeSorterFlushPMA(pSorter);
    (pSorter->list).szPMA = 0;
    pSorter->iMemory = 0;
  }
LAB_00143879:
  piVar1 = &(pSorter->list).szPMA;
  *piVar1 = *piVar1 + iVar9;
  if (pSorter->mxKeysize < iVar9) {
    pSorter->mxKeysize = iVar9;
  }
  puVar6 = (pSorter->list).aMemory;
  if (puVar6 == (u8 *)0x0) {
    nBytes = (SorterRecord *)sqlite3Malloc((long)iVar16);
    if (nBytes == (SorterRecord *)0x0) {
      return 7;
    }
    nBytes->u = (anon_union_8_2_0134e7e8_for_u)(pSorter->list).pList;
    goto LAB_0014398f;
  }
  pSVar11 = (SorterRecord *)((long)iVar16 + (long)pSorter->iMemory);
  pSVar14 = (SorterRecord *)(long)pSorter->nMemory;
  if (pSorter->nMemory < (int)pSVar11) {
    pSVar7 = (pSorter->list).pList;
    do {
      pSVar14 = (SorterRecord *)((long)pSVar14 * 2);
    } while ((long)pSVar14 < (long)pSVar11);
    bVar8 = false;
    nBytes = (SorterRecord *)(long)pSorter->mxPmaSize;
    if ((long)pSVar14 < (long)pSorter->mxPmaSize) {
      nBytes = pSVar14;
    }
    if ((long)nBytes <= (long)pSVar11) {
      nBytes = pSVar11;
    }
    local_38 = pVal;
    puVar12 = (u8 *)sqlite3Realloc(puVar6,(u64)nBytes);
    pVal = local_38;
    if (puVar12 != (u8 *)0x0) {
      uVar15 = -(uint)(pSVar7 == (SorterRecord *)0x0) | (int)pSVar7 - (int)puVar6;
      if (-1 < (int)uVar15) {
        (pSorter->list).pList = (SorterRecord *)(puVar12 + uVar15);
      }
      (pSorter->list).aMemory = puVar12;
      pSorter->nMemory = (int)nBytes;
      goto LAB_00143915;
    }
  }
  else {
LAB_00143915:
    pSVar14 = (pSorter->list).pList;
    puVar6 = (pSorter->list).aMemory;
    nBytes = (SorterRecord *)(puVar6 + pSorter->iMemory);
    pSorter->iMemory = (iVar3 + 0x17U & 0xfffffff8) + pSorter->iMemory;
    bVar8 = true;
    if (pSVar14 != (SorterRecord *)0x0) {
      (nBytes->u).iNext = (int)pSVar14 - (int)puVar6;
    }
  }
  if (!bVar8) {
    return 7;
  }
LAB_0014398f:
  memcpy(nBytes + 1,pVal->z,(long)pVal->n);
  nBytes->nVal = pVal->n;
  (pSorter->list).pList = nBytes;
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterWrite(
  const VdbeCursor *pCsr,         /* Sorter cursor */
  Mem *pVal                       /* Memory cell containing record */
){
  VdbeSorter *pSorter;
  int rc = SQLITE_OK;             /* Return Code */
  SorterRecord *pNew;             /* New list element */
  int bFlush;                     /* True to flush contents of memory to PMA */
  int nReq;                       /* Bytes of memory required */
  int nPMA;                       /* Bytes of PMA space required */
  int t;                          /* serial type of first record field */

  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  getVarint32NR((const u8*)&pVal->z[1], t);
  if( t>0 && t<10 && t!=7 ){
    pSorter->typeMask &= SORTER_TYPE_INTEGER;
  }else if( t>10 && (t & 0x01) ){
    pSorter->typeMask &= SORTER_TYPE_TEXT;
  }else{
    pSorter->typeMask = 0;
  }

  assert( pSorter );

  /* Figure out whether or not the current contents of memory should be
  ** flushed to a PMA before continuing. If so, do so.
  **
  ** If using the single large allocation mode (pSorter->aMemory!=0), then
  ** flush the contents of memory to a new PMA if (a) at least one value is
  ** already in memory and (b) the new value will not fit in memory.
  **
  ** Or, if using separate allocations for each record, flush the contents
  ** of memory to a PMA if either of the following are true:
  **
  **   * The total memory allocated for the in-memory list is greater
  **     than (page-size * cache-size), or
  **
  **   * The total memory allocated for the in-memory list is greater
  **     than (page-size * 10) and sqlite3HeapNearlyFull() returns true.
  */
  nReq = pVal->n + sizeof(SorterRecord);
  nPMA = pVal->n + sqlite3VarintLen(pVal->n);
  if( pSorter->mxPmaSize ){
    if( pSorter->list.aMemory ){
      bFlush = pSorter->iMemory && (pSorter->iMemory+nReq) > pSorter->mxPmaSize;
    }else{
      bFlush = (
          (pSorter->list.szPMA > pSorter->mxPmaSize)
       || (pSorter->list.szPMA > pSorter->mnPmaSize && sqlite3HeapNearlyFull())
      );
    }
    if( bFlush ){
      rc = vdbeSorterFlushPMA(pSorter);
      pSorter->list.szPMA = 0;
      pSorter->iMemory = 0;
      assert( rc!=SQLITE_OK || pSorter->list.pList==0 );
    }
  }

  pSorter->list.szPMA += nPMA;
  if( nPMA>pSorter->mxKeysize ){
    pSorter->mxKeysize = nPMA;
  }

  if( pSorter->list.aMemory ){
    int nMin = pSorter->iMemory + nReq;

    if( nMin>pSorter->nMemory ){
      u8 *aNew;
      sqlite3_int64 nNew = 2 * (sqlite3_int64)pSorter->nMemory;
      int iListOff = -1;
      if( pSorter->list.pList ){
        iListOff = (u8*)pSorter->list.pList - pSorter->list.aMemory;
      }
      while( nNew < nMin ) nNew = nNew*2;
      if( nNew > pSorter->mxPmaSize ) nNew = pSorter->mxPmaSize;
      if( nNew < nMin ) nNew = nMin;
      aNew = sqlite3Realloc(pSorter->list.aMemory, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      if( iListOff>=0 ){
        pSorter->list.pList = (SorterRecord*)&aNew[iListOff];
      }
      pSorter->list.aMemory = aNew;
      pSorter->nMemory = nNew;
    }

    pNew = (SorterRecord*)&pSorter->list.aMemory[pSorter->iMemory];
    pSorter->iMemory += ROUND8(nReq);
    if( pSorter->list.pList ){
      pNew->u.iNext = (int)((u8*)(pSorter->list.pList) - pSorter->list.aMemory);
    }
  }else{
    pNew = (SorterRecord *)sqlite3Malloc(nReq);
    if( pNew==0 ){
      return SQLITE_NOMEM_BKPT;
    }
    pNew->u.pNext = pSorter->list.pList;
  }

  memcpy(SRVAL(pNew), pVal->z, pVal->n);
  pNew->nVal = pVal->n;
  pSorter->list.pList = pNew;

  return rc;
}